

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsvchdir.c
# Opt level: O2

int main(int argc,char **argv)

{
  __dev_t _Var1;
  __ino_t _Var2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  stat s;
  
  progname = *argv;
  pcVar5 = argv[1];
  if (pcVar5 == (char *)0x0) {
    usage();
    pcVar5 = argv[1];
  }
  new = pcVar5;
  if (*pcVar5 == '.') {
    fatalx(pcVar5,": must not start with a dot.");
  }
  iVar3 = chdir("/etc/runit/runsvdir");
  if (iVar3 == -1) {
    fatal("unable to chdir: ","/etc/runit/runsvdir");
  }
  iVar3 = stat(new,(stat *)&s);
  if (iVar3 == -1) {
    piVar4 = __errno_location();
    if (*piVar4 == error_noent) {
      fatal(new,(char *)0x0);
    }
    fatal("unable to stat: ",new);
  }
  if ((s.st_mode & 0xf000) != 0x4000) {
    fatalx(new,"not a directory.");
  }
  _Var2 = s.st_ino;
  _Var1 = s.st_dev;
  iVar3 = stat("current",(stat *)&s);
  if (iVar3 == -1) {
    fatal("unable to stat: ","current");
  }
  if ((s.st_ino == (long)(int)_Var2) && (s.st_dev == (long)(int)_Var1)) {
    buffer_puts(buffer_1,"runsvchdir: ");
    buffer_puts(buffer_1,new);
    pcVar5 = ": current.\n";
  }
  else {
    iVar3 = unlink("current.new");
    if (iVar3 == -1) {
      piVar4 = __errno_location();
      if (*piVar4 != error_noent) {
        fatal("unable to unlink: ","current.new");
      }
    }
    iVar3 = symlink(new,"current.new");
    if (iVar3 == -1) {
      fatal("unable to create: current.new -> ",new);
    }
    iVar3 = unlink("previous");
    if (iVar3 == -1) {
      piVar4 = __errno_location();
      if (*piVar4 != error_noent) {
        fatal("unable to unlink: ","previous");
      }
    }
    iVar3 = rename("current","previous");
    if (iVar3 == -1) {
      fatal("unable to copy: current to ","previous");
    }
    iVar3 = rename("current.new","current");
    if (iVar3 == -1) {
      warn("unable to move: current.new to ","current");
      iVar3 = rename("previous","current");
      if (iVar3 == -1) {
        fatal("unable to move previous back to ","current");
      }
      _exit(0x6f);
    }
    buffer_puts(buffer_1,"runsvchdir: ");
    buffer_puts(buffer_1,new);
    pcVar5 = ": now current.\n";
  }
  buffer_puts(buffer_1,pcVar5);
  buffer_flush(buffer_1);
  _exit(0);
}

Assistant:

int main (int argc, char **argv) {
  struct stat s;
  int dev;
  int ino;

  progname =*argv++;
  if (! argv || ! *argv) usage();

  new =*argv;
  if (new[0] == '.') fatalx(new, ": must not start with a dot.");
  if (chdir(SVDIR) == -1) fatal("unable to chdir: ", SVDIR);

  if (stat(new, &s) == -1) {
    if (errno == error_noent) fatal(new, 0);
    fatal("unable to stat: ", new);
  }
  if (! S_ISDIR(s.st_mode)) fatalx(new, "not a directory.");
  ino =s.st_ino;
  dev =s.st_dev;
  if (stat("current", &s) == -1) fatal("unable to stat: ", "current");
  if ((s.st_ino == ino) && (s.st_dev == dev)) {
    buffer_puts(buffer_1, "runsvchdir: ");
    buffer_puts(buffer_1, new);
    buffer_puts(buffer_1, ": current.\n");
    buffer_flush(buffer_1);
    _exit(0);
  }

  if (unlink("current.new") == -1)
    if (errno != error_noent) fatal("unable to unlink: ", "current.new");
  if (symlink(new, "current.new") == -1)
    fatal("unable to create: current.new -> ", new);
  if (unlink("previous") == -1)
    if (errno != error_noent) fatal("unable to unlink: ", "previous");
  if (rename("current", "previous") == -1)
    fatal("unable to copy: current to ", "previous");
  if (rename("current.new", "current") == -1) {
    warn("unable to move: current.new to ", "current");
    if (rename("previous", "current") == -1)
      fatal("unable to move previous back to ", "current");
    _exit(111);
  }
  buffer_puts(buffer_1, "runsvchdir: ");
  buffer_puts(buffer_1, new);
  buffer_puts(buffer_1, ": now current.\n");
  buffer_flush(buffer_1);
  _exit(0);
}